

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QSize __thiscall QWidget::sizeIncrement(QWidget *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if ((lVar1 == 0) || (lVar1 = *(long *)(lVar1 + 8), lVar1 == 0)) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar2 = (long)*(short *)(lVar1 + 0x8a) << 0x20;
    uVar3 = (ulong)(uint)(int)*(short *)(lVar1 + 0x88);
  }
  return (QSize)(uVar2 | uVar3);
}

Assistant:

T *get() const noexcept
    {
        return d;
    }